

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void runtime::deInitList<runtime::Function>
               (list<runtime::Function_*,_std::allocator<runtime::Function_*>_> *items)

{
  Function *this;
  bool bVar1;
  reference ppFVar2;
  Function *first;
  list<runtime::Function_*,_std::allocator<runtime::Function_*>_> *items_local;
  
  while( true ) {
    bVar1 = std::__cxx11::list<runtime::Function_*,_std::allocator<runtime::Function_*>_>::empty
                      (items);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppFVar2 = std::__cxx11::list<runtime::Function_*,_std::allocator<runtime::Function_*>_>::front
                        (items);
    this = *ppFVar2;
    if (this != (Function *)0x0) {
      Function::~Function(this);
      operator_delete(this,0x30);
    }
    std::__cxx11::list<runtime::Function_*,_std::allocator<runtime::Function_*>_>::pop_front(items);
  }
  return;
}

Assistant:

void deInitList(std::list<T*> & items) {
  while (!items.empty()) {
    T* first = items.front();
    delete first;
    items.pop_front();
  }
}